

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::DistributionFunc::checkArguments
          (DistributionFunc *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  ulong uVar4;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,this->numArgs,
                     this->numArgs);
  if (bVar2) {
    if (this->numArgs != 0) {
      uVar4 = 0;
      do {
        bVar2 = Type::isIntegral((args->_M_ptr[uVar4]->type).ptr);
        if (!bVar2) {
          pTVar3 = SystemSubroutine::badArg
                             (&this->super_SystemSubroutine,context,args->_M_ptr[uVar4]);
          return pTVar3;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->numArgs);
    }
    pTVar3 = pCVar1->intType;
  }
  else {
    pTVar3 = pCVar1->errorType;
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, numArgs, numArgs))
            return comp.getErrorType();

        for (size_t i = 0; i < numArgs; i++) {
            if (!args[i]->type->isIntegral())
                return badArg(context, *args[i]);
        }

        return comp.getIntType();
    }